

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O0

string * __thiscall
cmMakefileTargetGenerator::GetLinkRule
          (string *__return_storage_ptr__,cmMakefileTargetGenerator *this,string *linkRuleVar)

{
  bool bVar1;
  string *psVar2;
  char *pcVar3;
  char *rule;
  allocator<char> local_59;
  undefined1 local_58 [8];
  string ruleVar;
  string *linkRuleVar_local;
  cmMakefileTargetGenerator *this_local;
  string *linkRule;
  
  psVar2 = cmMakefile::GetRequiredDefinition
                     ((this->super_cmCommonTargetGenerator).Makefile,linkRuleVar);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar2);
  bVar1 = cmGeneratorTarget::HasImplibGNUtoMS
                    ((this->super_cmCommonTargetGenerator).GeneratorTarget,
                     &(this->super_cmCommonTargetGenerator).ConfigName);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_58,"CMAKE_",&local_59);
    std::allocator<char>::~allocator(&local_59);
    cmGeneratorTarget::GetLinkerLanguage
              ((string *)&rule,(this->super_cmCommonTargetGenerator).GeneratorTarget,
               &(this->super_cmCommonTargetGenerator).ConfigName);
    std::__cxx11::string::operator+=((string *)local_58,(string *)&rule);
    std::__cxx11::string::~string((string *)&rule);
    std::__cxx11::string::operator+=((string *)local_58,"_GNUtoMS_RULE");
    pcVar3 = cmMakefile::GetDefinition
                       ((this->super_cmCommonTargetGenerator).Makefile,(string *)local_58);
    if (pcVar3 != (char *)0x0) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,pcVar3);
    }
    std::__cxx11::string::~string((string *)local_58);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmMakefileTargetGenerator::GetLinkRule(
  const std::string& linkRuleVar)
{
  std::string linkRule = this->Makefile->GetRequiredDefinition(linkRuleVar);
  if (this->GeneratorTarget->HasImplibGNUtoMS(this->ConfigName)) {
    std::string ruleVar = "CMAKE_";
    ruleVar += this->GeneratorTarget->GetLinkerLanguage(this->ConfigName);
    ruleVar += "_GNUtoMS_RULE";
    if (const char* rule = this->Makefile->GetDefinition(ruleVar)) {
      linkRule += rule;
    }
  }
  return linkRule;
}